

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O2

Trampoline * __thiscall
OrMeaning::Eval(Trampoline *__return_storage_ptr__,OrMeaning *this,Sexp *act)

{
  pointer ppSVar1;
  Sexp *pSVar2;
  pointer ppSVar3;
  Sexp *local_40;
  Sexp *act_local;
  Sexp *eval;
  FrameProtector __frame_prot;
  
  local_40 = act;
  FrameProtector::FrameProtector((FrameProtector *)&eval,"Eval");
  FrameProtector::ProtectValue((FrameProtector *)&eval,&local_40,"act");
  act_local = (Sexp *)0x0;
  FrameProtector::ProtectValue((FrameProtector *)&eval,&act_local,"eval");
  ppSVar3 = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppSVar3 == ppSVar1) {
      pSVar2 = GcHeap::AllocateBool(false);
      goto LAB_001181c0;
    }
    act_local = Evaluate(*ppSVar3,local_40);
  } while ((act_local->kind == BOOL) &&
          (ppSVar3 = ppSVar3 + 1, ((act_local->field_1).bool_value & 1U) == 0));
  pSVar2 = GcHeap::AllocateBool(true);
LAB_001181c0:
  __return_storage_ptr__->kind = Value;
  (__return_storage_ptr__->field_1).value = pSVar2;
  FrameProtector::~FrameProtector((FrameProtector *)&eval);
  return __return_storage_ptr__;
}

Assistant:

Trampoline OrMeaning::Eval(Sexp *act) {
  GC_HELPER_FRAME;
  GC_PROTECT(act);
  GC_PROTECTED_LOCAL(eval);

  for (auto &arg : arguments) {
    eval = Evaluate(arg, act);
    if (eval->IsTruthy()) {
      return GcHeap::AllocateBool(true);
    }
  }

  return GcHeap::AllocateBool(false);
}